

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O0

TypedExpectation<std::optional<solitaire::cards::Card>_()> * __thiscall
testing::internal::TypedExpectation<std::optional<solitaire::cards::Card>_()>::WillOnce
          (TypedExpectation<std::optional<solitaire::cards::Card>_()> *this,
          Action<std::optional<solitaire::cards::Card>_()> *action)

{
  Clause CVar1;
  bool bVar2;
  Action<std::optional<solitaire::cards::Card>_()> *this_00;
  size_type sVar3;
  Cardinality local_68;
  Action<std::optional<solitaire::cards::Card>_()> *local_58 [3];
  allocator<char> local_39;
  string local_38;
  Action<std::optional<solitaire::cards::Card>_()> *local_18;
  Action<std::optional<solitaire::cards::Card>_()> *action_local;
  TypedExpectation<std::optional<solitaire::cards::Card>_()> *this_local;
  
  CVar1 = (this->super_ExpectationBase).last_clause_;
  local_18 = action;
  action_local = (Action<std::optional<solitaire::cards::Card>_()> *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,
             ".WillOnce() cannot appear after .WillRepeatedly() or .RetiresOnSaturation().",
             &local_39);
  ExpectationBase::ExpectSpecProperty(&this->super_ExpectationBase,(int)CVar1 < 6,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  (this->super_ExpectationBase).last_clause_ = kWillOnce;
  this_00 = (Action<std::optional<solitaire::cards::Card>_()> *)operator_new(0x20);
  Action<std::optional<solitaire::cards::Card>_()>::Action(this_00,local_18);
  local_58[0] = this_00;
  std::vector<const_void_*,_std::allocator<const_void_*>_>::push_back
            (&(this->super_ExpectationBase).untyped_actions_,local_58);
  bVar2 = ExpectationBase::cardinality_specified(&this->super_ExpectationBase);
  if (!bVar2) {
    sVar3 = std::vector<const_void_*,_std::allocator<const_void_*>_>::size
                      (&(this->super_ExpectationBase).untyped_actions_);
    Exactly((testing *)&local_68,(int)sVar3);
    ExpectationBase::set_cardinality(&this->super_ExpectationBase,&local_68);
    Cardinality::~Cardinality(&local_68);
  }
  return this;
}

Assistant:

TypedExpectation& WillOnce(const Action<F>& action) {
    ExpectSpecProperty(last_clause_ <= kWillOnce,
                       ".WillOnce() cannot appear after "
                       ".WillRepeatedly() or .RetiresOnSaturation().");
    last_clause_ = kWillOnce;

    untyped_actions_.push_back(new Action<F>(action));
    if (!cardinality_specified()) {
      set_cardinality(Exactly(static_cast<int>(untyped_actions_.size())));
    }
    return *this;
  }